

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastSubtract(Gia_Man_t *pNew,int *pAdd0,int *pAdd1,int nBits,int Carry)

{
  long lVar1;
  int local_34;
  
  if (0 < nBits) {
    lVar1 = 0;
    local_34 = Carry;
    do {
      if ((int)*(uint *)((long)pAdd1 + lVar1) < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
      Wlc_BlastFullAdder(pNew,*(int *)((long)pAdd0 + lVar1),*(uint *)((long)pAdd1 + lVar1) ^ 1,
                         local_34,&local_34,(int *)((long)pAdd0 + lVar1));
      lVar1 = lVar1 + 4;
    } while ((ulong)(uint)nBits << 2 != lVar1);
  }
  return;
}

Assistant:

void Wlc_BlastSubtract( Gia_Man_t * pNew, int * pAdd0, int * pAdd1, int nBits, int Carry ) // result is in pAdd0
{
    int b;
    for ( b = 0; b < nBits; b++ )
        Wlc_BlastFullAdder( pNew, pAdd0[b], Abc_LitNot(pAdd1[b]), Carry, &Carry, &pAdd0[b] );
}